

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void free_tags(void)

{
  union_tag *puVar1;
  union_tag *__ptr;
  
  __ptr = tag_table;
  if (tag_table != (union_tag *)0x0) {
    do {
      puVar1 = __ptr->next;
      free(__ptr->name);
      free(__ptr);
      __ptr = puVar1;
    } while (puVar1 != (union_tag *)0x0);
  }
  tag_table = (union_tag *)0x0;
  return;
}

Assistant:

void free_tags()
{
union_tag	*p, *next;

    for (p = tag_table; p; p = next) {
	next = p->next;
	FREE(p->name);
	FREE(p); }
    tag_table = 0;
}